

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O3

void ON_SortUINT64Array(sort_algorithm sort_algorithm,ON__UINT64 *a,size_t nel)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ON__UINT64 *pOVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ON__UINT64 OVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ON__UINT64 *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (ON__UINT64 *)0x0) {
      uVar6 = nel >> 1;
      pOVar4 = a + (nel - 1);
      uVar7 = nel - 1;
      do {
        if (uVar6 == 0) {
          OVar10 = *pOVar4;
          *pOVar4 = *a;
          uVar7 = uVar7 - 1;
          if (uVar7 == 0) {
            *a = OVar10;
            return;
          }
          pOVar4 = pOVar4 + -1;
          uVar6 = 0;
        }
        else {
          OVar10 = a[uVar6 - 1];
          uVar6 = uVar6 - 1;
        }
        puVar5 = a + uVar6;
        uVar13 = uVar6;
        while (uVar11 = uVar13 * 2, uVar11 < uVar7) {
          puVar8 = a + uVar11 + 1;
          uVar13 = uVar11 | 1;
          if (uVar13 < uVar7) {
            uVar1 = *puVar8;
            uVar2 = a[uVar11 + 2];
            uVar15 = uVar1;
            if (uVar1 < uVar2) {
              puVar8 = a + uVar11 + 2;
              uVar15 = uVar2;
            }
            uVar13 = uVar13 + (uVar1 < uVar2);
          }
          else {
            uVar15 = *puVar8;
          }
          if (uVar15 <= OVar10) break;
          *puVar5 = uVar15;
          puVar5 = puVar8;
        }
        *puVar5 = OVar10;
      } while( true );
    }
  }
  else if (1 < nel && a != (ON__UINT64 *)0x0) {
    uVar6 = 0;
    puVar5 = a + (nel - 1);
LAB_005b18e6:
    while( true ) {
      iVar3 = (int)uVar6;
      uVar7 = ((long)puVar5 - (long)a >> 3) + 1;
      if (uVar7 < 9) break;
      puVar8 = (ulong *)((long)a + (uVar7 & 0xfffffffffffffffe) * 4);
      uVar7 = *a;
      uVar11 = *puVar8;
      uVar13 = uVar7;
      if (uVar11 < uVar7) {
        *a = uVar11;
        *puVar8 = uVar7;
        uVar13 = *a;
        uVar11 = uVar7;
      }
      uVar7 = *puVar5;
      if (uVar7 < uVar13) {
        *a = uVar7;
        *puVar5 = uVar13;
        uVar11 = *puVar8;
        uVar7 = uVar13;
      }
      puVar9 = a;
      puVar12 = puVar5;
      if (uVar7 < uVar11) {
        *puVar8 = uVar7;
        *puVar5 = uVar11;
      }
LAB_005b1943:
      if (puVar9 < puVar8) {
        do {
          puVar9 = puVar9 + 1;
          if (puVar8 <= puVar9) break;
        } while (*puVar9 <= *puVar8);
      }
      if (puVar8 <= puVar9) {
        do {
          puVar9 = puVar9 + 1;
          if (puVar5 < puVar9) break;
        } while (*puVar9 <= *puVar8);
      }
      do {
        puVar14 = puVar12;
        puVar12 = puVar14 + -1;
        if (puVar12 <= puVar8) break;
      } while (*puVar8 < *puVar12);
      if (puVar9 <= puVar12) {
        uVar7 = *puVar9;
        *puVar9 = *puVar12;
        *puVar12 = uVar7;
        if (puVar12 == puVar8) {
          puVar8 = puVar9;
        }
        goto LAB_005b1943;
      }
      if (puVar8 < puVar14) {
        do {
          puVar14 = puVar12;
          if (puVar14 <= puVar8) break;
          puVar12 = puVar14 + -1;
        } while (*puVar14 == *puVar8);
      }
      if (puVar14 <= puVar8) {
        do {
          puVar14 = puVar14 + -1;
          if (puVar14 <= a) break;
        } while (*puVar14 == *puVar8);
      }
      if ((long)puVar14 - (long)a < (long)puVar5 - (long)puVar9) goto LAB_005b1a72;
      if (a < puVar14) {
        auStack_208[iVar3] = a;
        auStack_3f8[iVar3] = puVar14;
        uVar6 = (ulong)(iVar3 + 1);
      }
      iVar3 = (int)uVar6;
      a = puVar9;
      if (puVar5 <= puVar9) goto LAB_005b1a95;
    }
    if (a < puVar5) {
      do {
        puVar8 = a;
        if (a + 1 <= puVar5) {
          uVar6 = *a;
          puVar9 = a + 1;
          do {
            if (uVar6 < *puVar9) {
              puVar8 = puVar9;
              uVar6 = *puVar9;
            }
            puVar9 = puVar9 + 1;
          } while (puVar9 <= puVar5);
        }
        uVar6 = *puVar8;
        *puVar8 = *puVar5;
        *puVar5 = uVar6;
        puVar5 = puVar5 + -1;
      } while (a < puVar5);
    }
    goto LAB_005b1a95;
  }
  return;
LAB_005b1a72:
  if (puVar9 < puVar5) {
    auStack_208[iVar3] = puVar9;
    auStack_3f8[iVar3] = puVar5;
    uVar6 = (ulong)(iVar3 + 1);
  }
  iVar3 = (int)uVar6;
  puVar5 = puVar14;
  if (puVar14 <= a) {
LAB_005b1a95:
    if (iVar3 < 1) {
      return;
    }
    uVar6 = (ulong)(iVar3 - 1);
    a = (ON__UINT64 *)auStack_208[uVar6];
    puVar5 = (ulong *)auStack_3f8[uVar6];
  }
  goto LAB_005b18e6;
}

Assistant:

void ON_SortUINT64Array(
        ON::sort_algorithm sort_algorithm,
        ON__UINT64* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint64(a,nel);
  else
    ON_qsort_uint64(a,nel);
}